

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O1

void __thiscall
Database::DatabaseImpl::GetTraffic
          (DatabaseImpl *this,string *port,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *time,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *traffic)

{
  bool bVar1;
  socklen_t __len;
  Statement query;
  string local_e8;
  Column local_c8;
  Statement local_a8;
  
  __len = (socklen_t)traffic;
  SQLite::Statement::Statement(&local_a8,&this->db_,"SELECT * FROM traffic WHERE port = @port");
  SQLite::Statement::bind(&local_a8,0x25d2e7,(sockaddr *)port,__len);
  while( true ) {
    bVar1 = SQLite::Statement::executeStep(&local_a8);
    if (!bVar1) break;
    SQLite::Statement::getColumn(&local_c8,&local_a8,1);
    SQLite::Column::getString_abi_cxx11_(&local_e8,&local_c8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)time,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    SQLite::Column::~Column(&local_c8);
    SQLite::Statement::getColumn(&local_c8,&local_a8,2);
    SQLite::Column::getString_abi_cxx11_(&local_e8,&local_c8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)traffic,
               &local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    SQLite::Column::~Column(&local_c8);
  }
  SQLite::Statement::~Statement(&local_a8);
  return;
}

Assistant:

void Database::DatabaseImpl::GetTraffic(const string& port, vector<string>& time, vector<string>& traffic)
{
    SQLite::Statement query(db_, "SELECT * FROM traffic WHERE port = @port");
    query.bind("@port", port);
    while(query.executeStep()) {
        time.push_back(query.getColumn(1));
        traffic.push_back(query.getColumn(2));
    }
}